

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

uint Abc_TtCanonicize(word *pTruth,int nVars,char *pCanonPerm)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint nWords;
  uint uVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  size_t __n;
  long lVar7;
  uint uCanonPhase;
  int pStoreIn [17];
  char pCanonPermCopy [16];
  uint local_bc;
  undefined8 local_b8;
  char *local_b0;
  ulong local_a8;
  long local_a0;
  int local_98 [20];
  char local_48 [24];
  
  local_b8 = CONCAT44(in_register_00000034,nVars);
  nWords = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  local_a8 = (ulong)nWords;
  if (0 < (int)nWords) {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCanonicize::pCopy1 + lVar4) =
           *(undefined8 *)((long)pTruth + lVar4);
      lVar4 = lVar4 + 8;
    } while (local_a8 * 8 - lVar4 != 0);
  }
  local_b0 = pCanonPerm;
  local_bc = Abc_TtSemiCanonicize(pTruth,nVars,pCanonPerm,local_98,0);
  iVar3 = 0;
  __n = (size_t)nVars;
  local_a0 = (ulong)(nVars - 2) + 1;
  while (1 < (int)local_b8) {
    uVar5 = 0;
    lVar4 = local_a0;
    do {
      if (local_98[lVar4 + -1] == local_98[lVar4]) {
        uVar2 = Abc_TtCofactorPerm(pTruth,(int)lVar4 + -1,nWords,
                                   (uint)(local_98[lVar4 + -1] != local_98[__n] / 2),local_b0,
                                   &local_bc,1);
        uVar5 = uVar5 | uVar2;
      }
      lVar7 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar7;
    } while (lVar7 != 0 && bVar1);
    if ((uVar5 == 0) || ((int)local_b8 < 3)) break;
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (local_98[uVar6] == local_98[uVar6 + 1]) {
        uVar2 = Abc_TtCofactorPerm(pTruth,(int)uVar6,nWords,
                                   (uint)(local_98[uVar6] != local_98[__n] / 2),local_b0,&local_bc,1
                                  );
        uVar5 = uVar5 | uVar2;
      }
      uVar6 = uVar6 + 1;
    } while (nVars - 1 != uVar6);
    if ((uVar5 == 0) || (iVar3 = iVar3 + 1, iVar3 == 5)) break;
  }
  uVar6 = local_a8;
  if (0 < (int)nWords) {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)Abc_TtCanonicize::pCopy2 + lVar4) =
           *(undefined8 *)((long)pTruth + lVar4);
      lVar4 = lVar4 + 8;
    } while (local_a8 * 8 - lVar4 != 0);
  }
  memcpy(local_48,local_b0,__n);
  uVar5 = local_bc;
  Abc_TtImplementNpnConfig(Abc_TtCanonicize::pCopy2,(int)local_b8,local_48,local_bc);
  if (0 < (int)nWords) {
    lVar4 = 0;
    do {
      if (*(long *)((long)Abc_TtCanonicize::pCopy1 + lVar4) !=
          *(long *)((long)Abc_TtCanonicize::pCopy2 + lVar4)) {
        puts("Canonical form verification failed!");
        return uVar5;
      }
      lVar4 = lVar4 + 8;
    } while (uVar6 << 3 != lVar4);
  }
  return uVar5;
}

Assistant:

unsigned Abc_TtCanonicize( word * pTruth, int nVars, char * pCanonPerm )
{
    int pStoreIn[17];
    unsigned uCanonPhase;
    int i, k, nWords = Abc_TtWordNum( nVars );
    int fNaive = 1;

#ifdef CANON_VERIFY
    char pCanonPermCopy[16];
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    uCanonPhase = Abc_TtSemiCanonicize( pTruth, nVars, pCanonPerm, pStoreIn, 0 );
    for ( k = 0; k < 5; k++ )
    {
        int fChanges = 0;
        for ( i = nVars - 2; i >= 0; i-- )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
        fChanges = 0;
        for ( i = 1; i < nVars - 1; i++ )
            if ( pStoreIn[i] == pStoreIn[i+1] )
                fChanges |= Abc_TtCofactorPerm( pTruth, i, nWords, pStoreIn[i] != pStoreIn[nVars]/2, pCanonPerm, &uCanonPhase, fNaive );
        if ( !fChanges )
            break;
    }

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    memcpy( pCanonPermCopy, pCanonPerm, sizeof(char) * nVars );
    Abc_TtImplementNpnConfig( pCopy2, nVars, pCanonPermCopy, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
/*
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
    {
        Kit_DsdPrintFromTruth( pCopy1, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( pCopy2, nVars ); printf( "\n" );
        i = 0;
    }
*/
    return uCanonPhase;
}